

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::InitializeFromParent(cmMakefile *this,cmMakefile *parent)

{
  PolicyStatus PVar1;
  char *pcVar2;
  char *__end;
  string *psVar3;
  cmStateSnapshot *this_00;
  pointer pcVar4;
  string defPropName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string local_d8;
  undefined1 local_b8 [40];
  cmStateSnapshot *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->SystemIncludeDirectories)._M_t,&(parent->SystemIncludeDirectories)._M_t);
  std::__cxx11::string::_M_assign((string *)&this->DefineFlags);
  std::__cxx11::string::_M_assign((string *)&this->DefineFlagsOrig);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM","");
  psVar3 = (string *)(local_b8 + 0x10);
  local_b8._0_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM","");
  local_90 = &parent->StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_88,local_90);
  pcVar2 = cmStateDirectory::GetProperty((cmStateDirectory *)local_88,(string *)local_b8);
  SetProperty(this,&local_d8,pcVar2);
  if ((string *)local_b8._0_8_ != psVar3) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  this_00 = &this->StateSnapshot;
  PVar1 = cmStateSnapshot::GetPolicy(this_00,CMP0043);
  if (PVar1 < NEW) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"COMPILE_DEFINITIONS","");
    local_b8._0_8_ = psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"COMPILE_DEFINITIONS","");
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_88,local_90);
    pcVar2 = cmStateDirectory::GetProperty((cmStateDirectory *)local_88,(string *)local_b8);
    SetProperty(this,&local_d8,pcVar2);
    if ((string *)local_b8._0_8_ != psVar3) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    local_b8._0_8_ = (string *)0x0;
    local_b8._8_8_ = (string *)0x0;
    local_b8._16_8_ = 0;
    GetConfigurations((string *)(local_78 + 0x28),this,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b8,true);
    local_78._24_8_ = this_00;
    local_78._32_8_ = parent;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._40_8_ != &local_40) {
      operator_delete((void *)local_78._40_8_,local_40._M_allocated_capacity + 1);
    }
    if (local_b8._0_8_ != local_b8._8_8_) {
      psVar3 = (string *)local_b8._0_8_;
      do {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"COMPILE_DEFINITIONS_","");
        cmsys::SystemTools::UpperCase((string *)local_88,psVar3);
        std::__cxx11::string::_M_append((char *)&local_d8,local_88._0_8_);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_88._0_8_ !=
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_78) {
          operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
        }
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_88,local_90);
        pcVar2 = cmStateDirectory::GetProperty((cmStateDirectory *)local_88,&local_d8);
        SetProperty(this,&local_d8,pcVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        psVar3 = psVar3 + 1;
      } while (psVar3 != (string *)local_b8._8_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
    parent = (cmMakefile *)local_78._32_8_;
    this_00 = (cmStateSnapshot *)local_78._24_8_;
  }
  pcVar4 = local_b8 + 0x10;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"LABELS","");
  local_b8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"LABELS","");
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_88,local_90);
  pcVar2 = cmStateDirectory::GetProperty((cmStateDirectory *)local_88,(string *)local_b8);
  SetProperty(this,&local_d8,pcVar2);
  if ((pointer)local_b8._0_8_ != pcVar4) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"LINK_LIBRARIES","");
  local_b8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"LINK_LIBRARIES","");
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_88,local_90);
  pcVar2 = cmStateDirectory::GetProperty((cmStateDirectory *)local_88,(string *)local_b8);
  SetProperty(this,&local_d8,pcVar2);
  if ((pointer)local_b8._0_8_ != pcVar4) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"LINK_DIRECTORIES","");
  local_b8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"LINK_DIRECTORIES","");
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_88,local_90);
  pcVar2 = cmStateDirectory::GetProperty((cmStateDirectory *)local_88,(string *)local_b8);
  SetProperty(this,&local_d8,pcVar2);
  if ((pointer)local_b8._0_8_ != pcVar4) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  cmStateSnapshot::GetProjectName_abi_cxx11_((string *)local_88,local_90);
  cmStateSnapshot::SetProjectName(this_00,(string *)local_88);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_88._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  std::__cxx11::string::_M_assign((string *)&this->ComplainFileRegularExpression);
  if (parent != this) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget*>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget*>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget*>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->ImportedTargets,&(parent->ImportedTargets)._M_h);
  }
  return;
}

Assistant:

void cmMakefile::InitializeFromParent(cmMakefile* parent)
{
  this->SystemIncludeDirectories = parent->SystemIncludeDirectories;

  // define flags
  this->DefineFlags = parent->DefineFlags;
  this->DefineFlagsOrig = parent->DefineFlagsOrig;

  // Include transform property.  There is no per-config version.
  {
    const char* prop = "IMPLICIT_DEPENDS_INCLUDE_TRANSFORM";
    this->SetProperty(prop, parent->GetProperty(prop));
  }

  // compile definitions property and per-config versions
  cmPolicies::PolicyStatus polSt = this->GetPolicyStatus(cmPolicies::CMP0043);
  if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
    this->SetProperty("COMPILE_DEFINITIONS",
                      parent->GetProperty("COMPILE_DEFINITIONS"));
    std::vector<std::string> configs;
    this->GetConfigurations(configs);
    for (std::vector<std::string>::const_iterator ci = configs.begin();
         ci != configs.end(); ++ci) {
      std::string defPropName = "COMPILE_DEFINITIONS_";
      defPropName += cmSystemTools::UpperCase(*ci);
      const char* prop = parent->GetProperty(defPropName);
      this->SetProperty(defPropName, prop);
    }
  }

  // labels
  this->SetProperty("LABELS", parent->GetProperty("LABELS"));

  // link libraries
  this->SetProperty("LINK_LIBRARIES", parent->GetProperty("LINK_LIBRARIES"));

  // link directories
  this->SetProperty("LINK_DIRECTORIES",
                    parent->GetProperty("LINK_DIRECTORIES"));

  // the initial project name
  this->StateSnapshot.SetProjectName(parent->StateSnapshot.GetProjectName());

  // Copy include regular expressions.
  this->ComplainFileRegularExpression = parent->ComplainFileRegularExpression;

  // Imported targets.
  this->ImportedTargets = parent->ImportedTargets;
}